

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O3

int Cudd_ApaPrintHex(FILE *fp,int digits,DdApaNumber number)

{
  int iVar1;
  ulong uVar2;
  
  if (0 < digits) {
    uVar2 = 0;
    do {
      iVar1 = fprintf((FILE *)fp,"%08x",(ulong)number[uVar2]);
      if (iVar1 == -1) {
        return 0;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)digits != uVar2);
  }
  return 1;
}

Assistant:

int
Cudd_ApaPrintHex(
  FILE * fp,
  int  digits,
  DdApaNumber  number)
{
    int i, result;

    for (i = 0; i < digits; i++) {
        result = fprintf(fp,DD_APA_HEXPRINT,number[i]);
        if (result == EOF)
            return(0);
    }
    return(1);

}